

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O0

code_point __thiscall
tcb::unicode::detail::utf_traits<char16_t,2>::
decode<std::istreambuf_iterator<char16_t,std::char_traits<char16_t>>,std::istreambuf_iterator<char16_t,std::char_traits<char16_t>>>
          (utf_traits<char16_t,2> *this,
          istreambuf_iterator<char16_t,_std::char_traits<char16_t>_> *current,
          istreambuf_iterator<char16_t,_std::char_traits<char16_t>_> last)

{
  bool bVar1;
  istreambuf_iterator<char16_t,_std::char_traits<char16_t>_> iVar2;
  bool local_79;
  istreambuf_iterator<char16_t,_std::char_traits<char16_t>_> local_68;
  char_type_conflict local_52;
  streambuf_type *psStack_50;
  uint16_t w2;
  int_type local_48;
  istreambuf_iterator<char16_t,_std::char_traits<char16_t>_> local_40;
  char_type_conflict local_2a;
  istreambuf_iterator<char16_t,_std::char_traits<char16_t>_> *piStack_28;
  uint16_t w1;
  istreambuf_iterator<char16_t,_std::char_traits<char16_t>_> *current_local;
  istreambuf_iterator<char16_t,_std::char_traits<char16_t>_> last_local;
  
  last_local._M_sbuf._0_2_ = last._M_sbuf._0_2_;
  piStack_28 = (istreambuf_iterator<char16_t,_std::char_traits<char16_t>_> *)this;
  current_local = current;
  bVar1 = std::operator==((istreambuf_iterator<char16_t,_std::char_traits<char16_t>_> *)this,
                          (istreambuf_iterator<char16_t,_std::char_traits<char16_t>_> *)
                          &current_local);
  if (bVar1) {
    last_local._12_4_ = 0xfffffffe;
  }
  else {
    iVar2 = std::istreambuf_iterator<char16_t,_std::char_traits<char16_t>_>::operator++
                      (piStack_28,0);
    psStack_50 = iVar2._M_sbuf;
    local_48 = iVar2._M_c;
    local_40._M_sbuf = psStack_50;
    local_40._M_c = local_48;
    local_2a = std::istreambuf_iterator<char16_t,_std::char_traits<char16_t>_>::operator*(&local_40)
    ;
    local_79 = (ushort)local_2a < 0xd800 || 0xdfff < (ushort)local_2a;
    if (local_79) {
      last_local._12_4_ = ZEXT24((ushort)local_2a);
    }
    else if ((ushort)local_2a < 0xdc00) {
      bVar1 = std::operator==(piStack_28,
                              (istreambuf_iterator<char16_t,_std::char_traits<char16_t>_> *)
                              &current_local);
      if (bVar1) {
        last_local._12_4_ = 0xfffffffe;
      }
      else {
        iVar2 = std::istreambuf_iterator<char16_t,_std::char_traits<char16_t>_>::operator++
                          (piStack_28,0);
        local_68._M_sbuf = iVar2._M_sbuf;
        local_68._M_c = iVar2._M_c;
        local_52 = std::istreambuf_iterator<char16_t,_std::char_traits<char16_t>_>::operator*
                             (&local_68);
        if (((ushort)local_52 < 0xdc00) || (0xdfff < (ushort)local_52)) {
          last_local._12_4_ = 0xffffffff;
        }
        else {
          last_local._12_4_ = utf_traits<char16_t,_2>::combine_surrogate(local_2a,local_52);
        }
      }
    }
    else {
      last_local._12_4_ = 0xffffffff;
    }
  }
  return last_local._12_4_;
}

Assistant:

static TCB_CONSTEXPR14 code_point decode(It& current, S last)
    {
        if (TCB_UNLIKELY(current == last))
            return incomplete;
        uint16_t w1 = *current++;
        if (TCB_LIKELY(w1 < 0xD800 || 0xDFFF < w1)) {
            return w1;
        }
        if (w1 > 0xDBFF)
            return illegal;
        if (current == last)
            return incomplete;
        uint16_t w2 = *current++;
        if (w2 < 0xDC00 || 0xDFFF < w2)
            return illegal;
        return combine_surrogate(w1, w2);
    }